

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

void __thiscall google::protobuf::io::StringOutputStream::BackUp(StringOutputStream *this,int count)

{
  LogMessage *pLVar1;
  string *psVar2;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (count < 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xad);
    pLVar1 = internal::LogMessage::operator<<(&local_58,"CHECK failed: (count) >= (0): ");
    internal::LogFinisher::operator=(&local_59,pLVar1);
    internal::LogMessage::~LogMessage(&local_58);
  }
  psVar2 = this->target_;
  if (psVar2 == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xae);
    pLVar1 = internal::LogMessage::operator<<(&local_58,"CHECK failed: target_ != NULL: ");
    internal::LogFinisher::operator=(&local_59,pLVar1);
    internal::LogMessage::~LogMessage(&local_58);
    psVar2 = this->target_;
  }
  if (psVar2->_M_string_length < (ulong)(long)count) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xaf);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_58,"CHECK failed: (count) <= (target_->size()): ");
    internal::LogFinisher::operator=(&local_59,pLVar1);
    internal::LogMessage::~LogMessage(&local_58);
    psVar2 = this->target_;
  }
  std::__cxx11::string::resize((ulong)psVar2);
  return;
}

Assistant:

void StringOutputStream::BackUp(int count) {
  GOOGLE_CHECK_GE(count, 0);
  GOOGLE_CHECK(target_ != NULL);
  GOOGLE_CHECK_LE(count, target_->size());
  target_->resize(target_->size() - count);
}